

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Qentem::Array<unsigned_int>::operator+=(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  SizeT new_size;
  
  new_size = src->index_ + this->index_;
  if (this->capacity_ < new_size) {
    resize(this,new_size);
  }
  this->index_ = this->index_ + src->index_;
  if ((ulong)src->index_ != 0) {
    puVar2 = src->storage_;
    puVar1 = puVar2 + src->index_;
    puVar3 = this->storage_;
    do {
      *puVar3 = *puVar2;
      puVar3 = puVar3 + 1;
      puVar2 = puVar2 + 1;
    } while (puVar2 < puVar1);
  }
  return;
}

Assistant:

void operator+=(const Array &src) {
        const SizeT n_size = (Size() + src.Size());

        if (n_size > Capacity()) {
            resize(n_size);
        }

        index_ += src.Size();

        Type_T       *storage  = Storage();
        const Type_T *src_item = src.First();
        const Type_T *src_end  = (src_item + src.Size());

        while (src_item < src_end) {
            Memory::Initialize(storage, *src_item);
            ++storage;
            ++src_item;
        }
    }